

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.c
# Opt level: O1

int xmllintShellRegisterNamespace
              (xmllintShellCtxtPtr ctxt,char *arg,xmlNodePtr node,xmlNodePtr node2)

{
  int iVar1;
  char *pcVar2;
  undefined1 *puVar3;
  undefined1 *puVar4;
  char *pcVar5;
  char *pcVar6;
  
  pcVar2 = (char *)xmlStrdup(arg);
  pcVar6 = pcVar2;
  while( true ) {
    pcVar5 = pcVar6;
    if ((pcVar5 == (char *)0x0) || (*pcVar5 == '\0')) goto LAB_0010bb2c;
    puVar3 = (undefined1 *)xmlStrchr(pcVar5,0x3d);
    if (puVar3 == (undefined1 *)0x0) break;
    puVar4 = puVar3 + 1;
    *puVar3 = 0;
    puVar3 = (undefined1 *)xmlStrchr(puVar4,0x20);
    if (puVar3 == (undefined1 *)0x0) {
      pcVar6 = (char *)0x0;
    }
    else {
      pcVar6 = puVar3 + 1;
      *puVar3 = 0;
    }
    iVar1 = xmlXPathRegisterNs(ctxt->pctxt,pcVar5,puVar4);
    if (iVar1 != 0) {
      fprintf((FILE *)ctxt->output,
              "Error: unable to register NS with prefix=\"%s\" and href=\"%s\"\n",pcVar5,puVar4);
LAB_0010bb2c:
      iVar1 = (*_xmlFree)(pcVar2);
      return iVar1;
    }
  }
  fwrite("setns: prefix=[nsuri] required\n",0x1f,1,(FILE *)ctxt->output);
  goto LAB_0010bb2c;
}

Assistant:

static int
xmllintShellRegisterNamespace(xmllintShellCtxtPtr ctxt, char *arg,
      xmlNodePtr node ATTRIBUTE_UNUSED, xmlNodePtr node2 ATTRIBUTE_UNUSED)
{
    xmlChar* nsListDup;
    xmlChar* prefix;
    xmlChar* href;
    xmlChar* next;

    nsListDup = xmlStrdup((xmlChar *) arg);
    next = nsListDup;
    while(next != NULL) {
	/* skip spaces */
	/*while((*next) == ' ') next++;*/
	if((*next) == '\0') break;

	/* find prefix */
	prefix = next;
	next = (xmlChar*)xmlStrchr(next, '=');
	if(next == NULL) {
	    fprintf(ctxt->output, "setns: prefix=[nsuri] required\n");
	    xmlFree(nsListDup);
	    return(-1);
	}
	*(next++) = '\0';

	/* find href */
	href = next;
	next = (xmlChar*)xmlStrchr(next, ' ');
	if(next != NULL) {
	    *(next++) = '\0';
	}

	/* do register namespace */
	if(xmlXPathRegisterNs(ctxt->pctxt, prefix, href) != 0) {
	    fprintf(ctxt->output,"Error: unable to register NS with prefix=\"%s\" and href=\"%s\"\n", prefix, href);
	    xmlFree(nsListDup);
	    return(-1);
	}
    }

    xmlFree(nsListDup);
    return(0);
}